

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

int32_t binarySearch(uint16_t *array,int32_t lenarray,uint16_t ikey)

{
  int iVar1;
  uint16_t middleValue;
  int32_t middleIndex;
  int32_t high;
  int32_t low;
  uint16_t ikey_local;
  int32_t lenarray_local;
  uint16_t *array_local;
  
  low = 0;
  high = lenarray + -1;
  while( true ) {
    while( true ) {
      if (high < low) {
        return -(low + 1);
      }
      iVar1 = low + high >> 1;
      if (ikey <= array[iVar1]) break;
      low = iVar1 + 1;
    }
    if (array[iVar1] <= ikey) break;
    high = iVar1 + -1;
  }
  return iVar1;
}

Assistant:

inline int32_t binarySearch(const uint16_t *array, int32_t lenarray,
                            uint16_t ikey) {
    int32_t low = 0;
    int32_t high = lenarray - 1;
    while (low <= high) {
        int32_t middleIndex = (low + high) >> 1;
        uint16_t middleValue = array[middleIndex];
        if (middleValue < ikey) {
            low = middleIndex + 1;
        } else if (middleValue > ikey) {
            high = middleIndex - 1;
        } else {
            return middleIndex;
        }
    }
    return -(low + 1);
}